

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

void polyscope::view::buildViewGui(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  NavigateStyle newStyle;
  bool bVar2;
  bool bVar3;
  NavigateStyle style;
  ProjectionMode extraout_EDX;
  ProjectionMode extraout_EDX_00;
  ProjectionMode mode;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  long lVar5;
  float height;
  int width;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 extraout_var_00 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  vec3 vVar12;
  int currHeight;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_8c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_88;
  string upStyleName;
  float farClipRatioF;
  float nearClipRatioF;
  float fovF;
  float moveScaleF;
  string viewStyleName;
  undefined1 extraout_var [60];
  undefined1 auVar11 [56];
  
  ImGui::SetNextItemOpen(false,4);
  if (openSlicePlaneMenu == '\x01') {
    ImGui::SetNextItemOpen(true,0);
  }
  bVar2 = ImGui::TreeNode("View");
  if (bVar2) {
    to_string_abi_cxx11_(&viewStyleName,(view *)(ulong)view::style,style);
    ImGui::PushItemWidth(120.0);
    bVar2 = ImGui::BeginCombo("##View Style",viewStyleName._M_dataplus._M_p,0);
    if (bVar2) {
      uVar4 = extraout_RDX;
      for (lVar5 = 0; lVar5 != 0x14; lVar5 = lVar5 + 4) {
        newStyle = *(NavigateStyle *)((long)&DAT_002c2290 + lVar5);
        to_string_abi_cxx11_(&upStyleName,(view *)(ulong)newStyle,(NavigateStyle)uVar4);
        currHeight = 0;
        aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
        bVar2 = ImGui::Selectable(upStyleName._M_dataplus._M_p,view::style == newStyle,0,
                                  (ImVec2 *)&currHeight);
        std::__cxx11::string::~string((string *)&upStyleName);
        uVar4 = extraout_RDX_00;
        if (bVar2) {
          setNavigateStyle(newStyle,true);
          ImGui::SetItemDefaultFocus();
          uVar4 = extraout_RDX_01;
        }
      }
      ImGui::EndCombo();
    }
    ImGui::SameLine(0.0,-1.0);
    ImGui::Text("Camera Style");
    ImGui::PushItemWidth(120.0);
    paVar1 = &upStyleName.field_2;
    upStyleName._M_string_length = 0;
    upStyleName.field_2._M_local_buf[0] = '\0';
    upStyleName._M_dataplus._M_p = (pointer)paVar1;
    if (upDir < 6) {
      std::__cxx11::string::assign((char *)&upStyleName);
    }
    bVar2 = ImGui::BeginCombo("##Up Direction",upStyleName._M_dataplus._M_p,0);
    if (bVar2) {
      currHeight = 0;
      aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      bVar2 = ImGui::Selectable("X Up",upDir == 0,0,(ImVec2 *)&currHeight);
      if (bVar2) {
        upDir = 0;
        flyToHomeView();
        ImGui::SetItemDefaultFocus();
      }
      currHeight = 0;
      aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      bVar2 = ImGui::Selectable("-X Up",upDir == 3,0,(ImVec2 *)&currHeight);
      if (bVar2) {
        upDir = 3;
        flyToHomeView();
        ImGui::SetItemDefaultFocus();
      }
      currHeight = 0;
      aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      bVar2 = ImGui::Selectable("Y Up",upDir == 1,0,(ImVec2 *)&currHeight);
      if (bVar2) {
        upDir = 1;
        flyToHomeView();
        ImGui::SetItemDefaultFocus();
      }
      currHeight = 0;
      aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      bVar2 = ImGui::Selectable("-Y Up",upDir == 4,0,(ImVec2 *)&currHeight);
      if (bVar2) {
        upDir = 4;
        flyToHomeView();
        ImGui::SetItemDefaultFocus();
      }
      currHeight = 0;
      aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      bVar2 = ImGui::Selectable("Z Up",upDir == 2,0,(ImVec2 *)&currHeight);
      if (bVar2) {
        upDir = 2;
        flyToHomeView();
        ImGui::SetItemDefaultFocus();
      }
      currHeight = 0;
      aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      bVar2 = ImGui::Selectable("-Z Up",upDir == 5,0,(ImVec2 *)&currHeight);
      if (bVar2) {
        upDir = 5;
        flyToHomeView();
        ImGui::SetItemDefaultFocus();
      }
      ImGui::EndCombo();
    }
    ImGui::SameLine(0.0,-1.0);
    ImGui::Text("Up Direction");
    std::__cxx11::string::~string((string *)&upStyleName);
    ImGui::PushItemWidth(120.0);
    upStyleName._M_string_length = 0;
    upStyleName.field_2._M_local_buf[0] = '\0';
    upStyleName._M_dataplus._M_p = (pointer)paVar1;
    if (frontDir < 6) {
      std::__cxx11::string::assign((char *)&upStyleName);
    }
    bVar2 = ImGui::BeginCombo("##Front Direction",upStyleName._M_dataplus._M_p,0);
    if (bVar2) {
      currHeight = 0;
      aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      bVar2 = ImGui::Selectable("X Front",frontDir == 0,0,(ImVec2 *)&currHeight);
      if (bVar2) {
        setFrontDir(XFront,true);
        ImGui::SetItemDefaultFocus();
      }
      currHeight = 0;
      aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      bVar2 = ImGui::Selectable("-X Front",frontDir == 3,0,(ImVec2 *)&currHeight);
      if (bVar2) {
        setFrontDir(NegXFront,true);
        ImGui::SetItemDefaultFocus();
      }
      currHeight = 0;
      aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      bVar2 = ImGui::Selectable("Y Front",frontDir == 1,0,(ImVec2 *)&currHeight);
      if (bVar2) {
        setFrontDir(YFront,true);
        ImGui::SetItemDefaultFocus();
      }
      currHeight = 0;
      aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      bVar2 = ImGui::Selectable("-Y Front",frontDir == 4,0,(ImVec2 *)&currHeight);
      if (bVar2) {
        setFrontDir(NegYFront,true);
        ImGui::SetItemDefaultFocus();
      }
      currHeight = 0;
      aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      bVar2 = ImGui::Selectable("Z Front",frontDir == 2,0,(ImVec2 *)&currHeight);
      if (bVar2) {
        setFrontDir(ZFront,true);
        ImGui::SetItemDefaultFocus();
      }
      currHeight = 0;
      aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      bVar2 = ImGui::Selectable("-Z Front",frontDir == 5,0,(ImVec2 *)&currHeight);
      if (bVar2) {
        setFrontDir(NegZFront,true);
        ImGui::SetItemDefaultFocus();
      }
      ImGui::EndCombo();
    }
    ImGui::SameLine(0.0,-1.0);
    ImGui::Text("Front Direction");
    std::__cxx11::string::~string((string *)&upStyleName);
    auVar11 = extraout_var_00;
    vVar12 = getUpVec();
    auVar8._0_8_ = vVar12._0_8_;
    auVar8._8_56_ = auVar11;
    upStyleName._M_dataplus._M_p = (pointer)vmovlps_avx(auVar8._0_16_);
    upStyleName._M_string_length = CONCAT44(upStyleName._M_string_length._4_4_,vVar12.field_2);
    vVar12 = getFrontVec();
    local_88 = vVar12.field_2;
    auVar9._0_8_ = vVar12._0_8_;
    auVar9._8_56_ = auVar11;
    _currHeight = (ImVec2)vmovlps_avx(auVar9._0_16_);
    auVar10._0_4_ =
         glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                   ((vec<3,_float,_(glm::qualifier)0> *)&upStyleName,
                    (vec<3,_float,_(glm::qualifier)0> *)&currHeight);
    auVar10._4_60_ = extraout_var;
    auVar6._8_4_ = 0x7fffffff;
    auVar6._0_8_ = 0x7fffffff7fffffff;
    auVar6._12_4_ = 0x7fffffff;
    auVar6 = vandps_avx512vl(auVar10._0_16_,auVar6);
    if (0.01 < auVar6._0_4_) {
      ImGui::TextUnformatted("WARNING: Up and Front directions\nare degenerate.",(char *)0x0);
    }
    moveScaleF = (float)moveScale;
    ImGui::SliderFloat(" Move Speed",&moveScaleF,0.0,2.0,"%.5f",0x60);
    moveScale = (double)moveScaleF;
    bVar2 = ImGui::TreeNode("Scene Extents");
    if (bVar2) {
      bVar2 = ImGui::Checkbox("Set automatically",(bool *)&options::automaticallyComputeSceneExtents
                             );
      if (bVar2) {
        updateStructureExtents();
      }
      if (options::automaticallyComputeSceneExtents == '\0') {
        if ((buildViewGui::lengthScaleUpper == -777.0) && (!NAN(buildViewGui::lengthScaleUpper))) {
          buildViewGui::lengthScaleUpper = state::lengthScale + state::lengthScale;
        }
        bVar2 = ImGui::SliderFloat("Length Scale",&state::lengthScale,0.0,
                                   buildViewGui::lengthScaleUpper,"%.5f",0);
        if (bVar2) {
          requestRedraw();
        }
        bVar2 = ImGui::IsItemDeactivatedAfterEdit();
        if (bVar2) {
          dVar7 = fmax((double)state::lengthScale + (double)state::lengthScale,
                       (double)buildViewGui::lengthScaleUpper);
          buildViewGui::lengthScaleUpper = (float)dVar7;
        }
        ImGui::TextUnformatted("Bounding Box:",(char *)0x0);
        ImGui::PushItemWidth(200.0);
        bVar2 = ImGui::InputFloat3("min",(float *)&DAT_0059ccd4,"%.3f",0);
        if (bVar2) {
          updateStructureExtents();
        }
        bVar2 = ImGui::InputFloat3("max",(float *)&state::boundingBox,"%.3f",0);
        if (bVar2) {
          updateStructureExtents();
        }
        ImGui::PopItemWidth();
      }
      ImGui::TreePop();
    }
    ImGui::SetNextItemOpen(false,4);
    bVar2 = ImGui::TreeNode("Camera Parameters");
    if (bVar2) {
      fovF = (float)fov;
      bVar2 = ImGui::SliderFloat(" Field of View",&fovF,5.0,160.0,"%.2f deg",0);
      if (bVar2) {
        fov = (double)fovF;
        requestRedraw();
      }
      nearClipRatioF = (float)nearClipRatio;
      farClipRatioF = (float)farClipRatio;
      bVar2 = ImGui::SliderFloat(" Clip Near",&nearClipRatioF,0.0,10.0,"%.5f",0x60);
      if (bVar2) {
        nearClipRatio = (double)nearClipRatioF;
        requestRedraw();
      }
      bVar2 = ImGui::SliderFloat(" Clip Far",&farClipRatioF,1.0,1000.0,"%.2f",0x60);
      mode = extraout_EDX;
      if (bVar2) {
        farClipRatio = (double)farClipRatioF;
        requestRedraw();
        mode = extraout_EDX_00;
      }
      to_string_abi_cxx11_(&upStyleName,(view *)(ulong)projectionMode,mode);
      bVar2 = ImGui::BeginCombo("##ProjectionMode",upStyleName._M_dataplus._M_p,0);
      if (bVar2) {
        currHeight = 0;
        aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
        bVar2 = ImGui::Selectable("Perspective",projectionMode == 0,0,(ImVec2 *)&currHeight);
        if (bVar2) {
          projectionMode = 0;
          requestRedraw();
          ImGui::SetItemDefaultFocus();
        }
        currHeight = 0;
        aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
        bVar2 = ImGui::Selectable("Orthographic",projectionMode == 1,0,(ImVec2 *)&currHeight);
        if (bVar2) {
          projectionMode = 1;
          requestRedraw();
          ImGui::SetItemDefaultFocus();
        }
        ImGui::EndCombo();
      }
      ImGui::SameLine(0.0,-1.0);
      ImGui::Text("Projection");
      ImGui::TreePop();
      std::__cxx11::string::~string((string *)&upStyleName);
    }
    bVar2 = ImGui::TreeNode("Window");
    if (bVar2) {
      ImGui::TextUnformatted("Dim:",(char *)0x0);
      ImGui::SameLine(0.0,-1.0);
      ImGui::PushItemWidth(50.0);
      upStyleName._M_dataplus._M_p._0_4_ = windowWidth;
      currHeight = (int)windowHeight;
      ImGui::InputInt("##width",(int *)&upStyleName,0,100,0);
      bVar2 = ImGui::IsItemDeactivatedAfterEdit();
      ImGui::SameLine(0.0,-1.0);
      ImGui::InputInt("##height",&currHeight,0,100,0);
      bVar3 = ImGui::IsItemDeactivatedAfterEdit();
      if (bVar2 || bVar3) {
        width = (int)upStyleName._M_dataplus._M_p;
        if ((int)upStyleName._M_dataplus._M_p < 0x21) {
          width = 0x20;
        }
        upStyleName._M_dataplus._M_p._0_4_ = width;
        height = 4.48416e-44;
        if (0x20 < currHeight) {
          height = (float)currHeight;
        }
        currHeight = (int)height;
        setWindowSize(width,(int)height);
      }
      ImGui::PopItemWidth();
      ImGui::SameLine(0.0,-1.0);
      upStyleName._M_dataplus._M_p =
           (pointer)(CONCAT71(upStyleName._M_dataplus._M_p._1_7_,windowResizable) ^ 1);
      bVar2 = ImGui::Checkbox("lock",(bool *)&upStyleName);
      if (bVar2) {
        setWindowResizable((bool)((byte)upStyleName._M_dataplus._M_p ^ 1));
      }
      ImGui::TreePop();
    }
    buildSlicePlaneGUI();
    ImGui::PopItemWidth();
    ImGui::TreePop();
    std::__cxx11::string::~string((string *)&viewStyleName);
  }
  return;
}

Assistant:

void buildViewGui() {

  ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
  if (openSlicePlaneMenu) {
    // need to recursively open this tree node to respect slice plane menu open flag
    ImGui::SetNextTreeNodeOpen(true);
  }
  if (ImGui::TreeNode("View")) {

    // == Camera style

    std::string viewStyleName = to_string(view::style);

    ImGui::PushItemWidth(120);
    std::array<NavigateStyle, 5> styles{NavigateStyle::Turntable, NavigateStyle::Free, NavigateStyle::Planar,
                                        NavigateStyle::None, NavigateStyle::FirstPerson};
    if (ImGui::BeginCombo("##View Style", viewStyleName.c_str())) {

      for (NavigateStyle s : styles) {
        if (ImGui::Selectable(to_string(s).c_str(), view::style == s)) {
          setNavigateStyle(s, true);
          ImGui::SetItemDefaultFocus();
        }
      }

      ImGui::EndCombo();
    }
    ImGui::SameLine();

    ImGui::Text("Camera Style");

    { // == Up direction
      ImGui::PushItemWidth(120);
      std::string upStyleName;
      switch (upDir) {
      case UpDir::XUp:
        upStyleName = "X Up";
        break;
      case UpDir::NegXUp:
        upStyleName = "-X Up";
        break;
      case UpDir::YUp:
        upStyleName = "Y Up";
        break;
      case UpDir::NegYUp:
        upStyleName = "-Y Up";
        break;
      case UpDir::ZUp:
        upStyleName = "Z Up";
        break;
      case UpDir::NegZUp:
        upStyleName = "-Z Up";
        break;
      }

      if (ImGui::BeginCombo("##Up Direction", upStyleName.c_str())) {
        if (ImGui::Selectable("X Up", view::upDir == view::UpDir::XUp)) {
          view::setUpDir(view::UpDir::XUp, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("-X Up", view::upDir == view::UpDir::NegXUp)) {
          view::setUpDir(view::UpDir::NegXUp, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("Y Up", view::upDir == view::UpDir::YUp)) {
          view::setUpDir(view::UpDir::YUp, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("-Y Up", view::upDir == view::UpDir::NegYUp)) {
          view::setUpDir(view::UpDir::NegYUp, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("Z Up", view::upDir == view::UpDir::ZUp)) {
          view::setUpDir(view::UpDir::ZUp, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("-Z Up", view::upDir == view::UpDir::NegZUp)) {
          view::setUpDir(view::UpDir::NegZUp, true);
          ImGui::SetItemDefaultFocus();
        }
        ImGui::EndCombo();
      }
      ImGui::SameLine();
      ImGui::Text("Up Direction");
    }

    { // == Front direction
      ImGui::PushItemWidth(120);
      std::string frontStyleName;
      switch (frontDir) {
      case FrontDir::XFront:
        frontStyleName = "X Front";
        break;
      case FrontDir::NegXFront:
        frontStyleName = "-X Front";
        break;
      case FrontDir::YFront:
        frontStyleName = "Y Front";
        break;
      case FrontDir::NegYFront:
        frontStyleName = "-Y Front";
        break;
      case FrontDir::ZFront:
        frontStyleName = "Z Front";
        break;
      case FrontDir::NegZFront:
        frontStyleName = "-Z Front";
        break;
      }

      if (ImGui::BeginCombo("##Front Direction", frontStyleName.c_str())) {
        if (ImGui::Selectable("X Front", view::frontDir == FrontDir::XFront)) {
          view::setFrontDir(FrontDir::XFront, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("-X Front", view::frontDir == FrontDir::NegXFront)) {
          view::setFrontDir(FrontDir::NegXFront, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("Y Front", view::frontDir == FrontDir::YFront)) {
          view::setFrontDir(FrontDir::YFront, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("-Y Front", view::frontDir == FrontDir::NegYFront)) {
          view::setFrontDir(FrontDir::NegYFront, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("Z Front", view::frontDir == FrontDir::ZFront)) {
          view::setFrontDir(FrontDir::ZFront, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("-Z Front", view::frontDir == FrontDir::NegZFront)) {
          view::setFrontDir(FrontDir::NegZFront, true);
          ImGui::SetItemDefaultFocus();
        }
        ImGui::EndCombo();
      }
      ImGui::SameLine();
      ImGui::Text("Front Direction");
    }

    {
      // Show a warning if up and front are co-linear
      glm::vec3 upDir = getUpVec();
      glm::vec3 frontDir = getFrontVec();
      if (std::fabs(glm::dot(upDir, frontDir)) > 0.01) {
        ImGui::TextUnformatted("WARNING: Up and Front directions\nare degenerate.");
      }
    }

    // Move speed
    float moveScaleF = view::moveScale;
    ImGui::SliderFloat(" Move Speed", &moveScaleF, 0.0, 2.0, "%.5f",
                       ImGuiSliderFlags_Logarithmic | ImGuiSliderFlags_NoRoundToFormat);
    view::moveScale = moveScaleF;


    if (ImGui::TreeNode("Scene Extents")) {

      if (ImGui::Checkbox("Set automatically", &options::automaticallyComputeSceneExtents)) {
        updateStructureExtents();
      }

      if (!options::automaticallyComputeSceneExtents) {

        static float lengthScaleUpper = -777;
        if (lengthScaleUpper == -777) lengthScaleUpper = 2. * state::lengthScale;
        if (ImGui::SliderFloat("Length Scale", &state::lengthScale, 0, lengthScaleUpper, "%.5f")) {
          requestRedraw();
        }
        if (ImGui::IsItemDeactivatedAfterEdit()) {
          // the upper bound for the slider is dynamically adjust to be a bit bigger than the lower bound, but only
          // does so on release of the widget (so it doesn't scaleo off to infinity), and only ever gets larger (so
          // you don't get stuck at 0)
          lengthScaleUpper = std::fmax(2. * state::lengthScale, lengthScaleUpper);
        }


        ImGui::TextUnformatted("Bounding Box:");
        ImGui::PushItemWidth(200);
        glm::vec3& bboxMin = std::get<0>(state::boundingBox);
        glm::vec3& bboxMax = std::get<1>(state::boundingBox);
        if (ImGui::InputFloat3("min", &bboxMin[0])) updateStructureExtents();
        if (ImGui::InputFloat3("max", &bboxMax[0])) updateStructureExtents();
        ImGui::PopItemWidth();
      }


      ImGui::TreePop();
    }


    ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
    if (ImGui::TreeNode("Camera Parameters")) {

      // Field of view
      float fovF = fov;
      if (ImGui::SliderFloat(" Field of View", &fovF, minFov, maxFov, "%.2f deg")) {
        fov = fovF;
        requestRedraw();
      };

      // Clip planes
      float nearClipRatioF = nearClipRatio;
      float farClipRatioF = farClipRatio;
      if (ImGui::SliderFloat(" Clip Near", &nearClipRatioF, 0., 10., "%.5f",
                             ImGuiSliderFlags_Logarithmic | ImGuiSliderFlags_NoRoundToFormat)) {
        nearClipRatio = nearClipRatioF;
        requestRedraw();
      }
      if (ImGui::SliderFloat(" Clip Far", &farClipRatioF, 1., 1000., "%.2f",
                             ImGuiSliderFlags_Logarithmic | ImGuiSliderFlags_NoRoundToFormat)) {
        farClipRatio = farClipRatioF;
        requestRedraw();
      }


      std::string projectionModeStr = to_string(view::projectionMode);
      if (ImGui::BeginCombo("##ProjectionMode", projectionModeStr.c_str())) {
        if (ImGui::Selectable("Perspective", view::projectionMode == ProjectionMode::Perspective)) {
          view::projectionMode = ProjectionMode::Perspective;
          requestRedraw();
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("Orthographic", view::projectionMode == ProjectionMode::Orthographic)) {
          view::projectionMode = ProjectionMode::Orthographic;
          requestRedraw();
          ImGui::SetItemDefaultFocus();
        }
        ImGui::EndCombo();
      }
      ImGui::SameLine();
      ImGui::Text("Projection");


      ImGui::TreePop();
    }

    if (ImGui::TreeNode("Window")) {

      {
        ImGui::TextUnformatted("Dim:");
        ImGui::SameLine();
        ImGui::PushItemWidth(50);
        bool changed = false;
        int currWidth = view::windowWidth;
        int currHeight = view::windowHeight;
        ImGui::InputInt("##width", &currWidth, 0);
        changed |= ImGui::IsItemDeactivatedAfterEdit();
        ImGui::SameLine();
        ImGui::InputInt("##height", &currHeight, 0);
        changed |= ImGui::IsItemDeactivatedAfterEdit();
        if (changed) {
          // make sure it's at least 32 pixels, anything less is surely a mistake and might break things
          currWidth = std::max(currWidth, 32);
          currHeight = std::max(currHeight, 32);
          view::setWindowSize(currWidth, currHeight);
        }
        ImGui::PopItemWidth();
      }

      {
        ImGui::SameLine();
        bool sizeLocked = !getWindowResizable();
        bool changed = ImGui::Checkbox("lock", &sizeLocked);
        if (changed) {
          setWindowResizable(!sizeLocked);
        }
      }


      ImGui::TreePop();
    }

    buildSlicePlaneGUI();

    ImGui::PopItemWidth();
    ImGui::TreePop();
  }
}